

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O3

Vector3d * __thiscall
OpenMD::Stats::getVectorError(Vector3d *__return_storage_ptr__,Stats *this,int index)

{
  VectorAccumulator *this_00;
  
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  this_00 = (VectorAccumulator *)
            __dynamic_cast((this->data_).
                           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                           ._M_impl.super__Vector_impl_data._M_start[index].accumulator,
                           &BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
  VectorAccumulator::get95percentConfidenceInterval(this_00,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Stats::getVectorError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    Vector3d value;
    dynamic_cast<VectorAccumulator*>(data_[index].accumulator)
        ->get95percentConfidenceInterval(value);
    return value;
  }